

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# codegen.cc
# Opt level: O2

void __thiscall kratos::SystemVerilogCodeGen::check_yosys_src(SystemVerilogCodeGen *this)

{
  pointer psVar1;
  bool bVar2;
  shared_ptr<kratos::Attribute> *attr;
  pointer psVar3;
  
  psVar1 = (this->generator_->super_IRNode).attributes_.
           super__Vector_base<std::shared_ptr<kratos::Attribute>,_std::allocator<std::shared_ptr<kratos::Attribute>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  for (psVar3 = (this->generator_->super_IRNode).attributes_.
                super__Vector_base<std::shared_ptr<kratos::Attribute>,_std::allocator<std::shared_ptr<kratos::Attribute>_>_>
                ._M_impl.super__Vector_impl_data._M_start; psVar3 != psVar1; psVar3 = psVar3 + 1) {
    bVar2 = std::operator==(&((psVar3->
                              super___shared_ptr<kratos::Attribute,_(__gnu_cxx::_Lock_policy)2>).
                             _M_ptr)->value_str,"yosys_src");
    if (bVar2) {
      (this->options_).yosys_src = true;
    }
  }
  return;
}

Assistant:

void SystemVerilogCodeGen::check_yosys_src() {
    for (auto const& attr : generator_->get_attributes()) {
        if (attr->value_str == "yosys_src") {
            options_.yosys_src = true;
        }
    }
}